

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RandomFreakOperator.cpp
# Opt level: O2

void __thiscall
lts2::RandomFreakOperator::initWithPatchSize(RandomFreakOperator *this,Size *patchSize)

{
  int iVar1;
  uint uVar2;
  uint j;
  int iVar3;
  uint uVar4;
  IntegratingCell *pIVar5;
  void *pvVar6;
  uint uVar7;
  uint i;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  uint *puVar12;
  uint ring;
  long lVar13;
  float fVar14;
  double dVar15;
  float local_78 [12];
  undefined8 local_48;
  float local_40;
  float local_3c;
  Size local_30;
  
  local_30 = *patchSize;
  LBDOperator::setPatchSize(&this->super_LBDOperator,&local_30);
  iVar1 = (this->super_LBDOperator)._patchSize.width;
  iVar3 = (this->super_LBDOperator)._patchSize.height;
  if (iVar1 < iVar3) {
    iVar3 = iVar1;
  }
  fVar14 = ((float)iVar3 * 22.0) / 1575.0;
  local_78[0] = (float)(iVar3 / 0x19);
  local_78[1] = fVar14 + local_78[0];
  local_78[2] = fVar14 * 3.0 + local_78[0];
  local_78[3] = fVar14 * 6.0 + local_78[0];
  local_78[4] = fVar14 * 10.0 + local_78[0];
  local_78[5] = fVar14 * 15.0 + local_78[0];
  local_78[6] = fVar14 * 21.0 + local_78[0];
  local_78[7] = 0.0;
  local_78[8] = local_78[0] * 0.5;
  local_78[9] = local_78[1] * 0.5;
  local_78[10] = local_78[2] * 0.5;
  local_78[0xb] = local_78[3] * 0.5;
  local_40 = local_78[6] * 0.5;
  local_48 = CONCAT44(local_78[5] * 0.5,local_78[4] * 0.5);
  local_3c = local_78[0] / 3.0;
  (this->super_LBDOperator)._patternPoints = 0x2b;
  pIVar5 = (this->super_LBDOperator)._sensitiveCells;
  if (pIVar5 == (IntegratingCell *)0x0) {
    uVar11 = 0x408;
  }
  else {
    operator_delete__(pIVar5);
    uVar11 = (ulong)(this->super_LBDOperator)._patternPoints * 0x18;
  }
  pIVar5 = (IntegratingCell *)operator_new__(uVar11);
  (this->super_LBDOperator)._sensitiveCells = pIVar5;
  puVar12 = FREAKS_CELLS_PER_RING;
  for (lVar13 = 0; lVar13 != 8; lVar13 = lVar13 + 1) {
    uVar2 = *puVar12;
    dVar15 = (double)uVar2;
    LBDOperator::updateRingCells
              (&this->super_LBDOperator,pIVar5,uVar2,local_78[lVar13 + 8],local_78[lVar13],
               (float)(6.283185307179586 / dVar15),
               (float)((double)(int)lVar13 * (3.141592653589793 / dVar15)));
    pIVar5 = pIVar5 + uVar2;
    puVar12 = puVar12 + 1;
  }
  uVar2 = (this->super_LBDOperator)._patternPoints;
  pvVar6 = operator_new__((ulong)((uVar2 - 1) * uVar2 >> 1) << 3);
  uVar7 = 0;
  for (uVar4 = 1; uVar4 < uVar2; uVar4 = uVar4 + 1) {
    uVar8 = 0;
    while( true ) {
      uVar9 = uVar7 + uVar8;
      if (uVar4 == uVar8) break;
      *(uint *)((long)pvVar6 + (ulong)uVar9 * 8) = uVar8;
      *(uint *)((long)pvVar6 + (ulong)uVar9 * 8 + 4) = uVar4;
      uVar8 = uVar8 + 1;
    }
    uVar7 = uVar9;
  }
  uVar11 = 0x2a;
  for (uVar10 = 0; uVar10 < *(uint *)&(this->super_LBDOperator).super_LinearOperator.field_0xc;
      uVar10 = uVar10 + 1) {
    uVar11 = (uVar11 >> 0x20) + (uVar11 & 0xffffffff) * 0xf83f630a;
    (this->super_LBDOperator)._basisFunctions[uVar10] =
         *(BasisFunction *)((long)pvVar6 + ((uVar11 & 0xffffffff) % 0x281) * 8);
  }
  operator_delete__(pvVar6);
  return;
}

Assistant:

void lts2::RandomFreakOperator::initWithPatchSize(cv::Size patchSize)
{
    // Set the size variable
    this->setPatchSize(patchSize);
    
    int patchRadius = MIN(_patchSize.width, _patchSize.height);
    
    // Update the filter sizes
    // unit = (smallest_radius - biggest_radius) / 21
    float unitSpace = 22.0f * patchRadius / 1575.f;
    
    float ringRadius[8];
    ringRadius[0] = patchRadius / 25;
    ringRadius[1] = ringRadius[0] + 1  * unitSpace; //
    ringRadius[2] = ringRadius[0] + 3  * unitSpace; //
    ringRadius[3] = ringRadius[0] + 6  * unitSpace; //
    ringRadius[4] = ringRadius[0] + 10 * unitSpace; // 
    ringRadius[5] = ringRadius[0] + 15 * unitSpace; // 
    ringRadius[6] = ringRadius[0] + 21 * unitSpace; //
    ringRadius[7] = 0;                              // Center point
    
    float filterSigma[8];
    filterSigma[0] = ringRadius[0] / 2;
    filterSigma[1] = ringRadius[1] / 2;
    filterSigma[2] = ringRadius[2] / 2;
    filterSigma[3] = ringRadius[3] / 2;
    filterSigma[4] = ringRadius[4] / 2;
    filterSigma[5] = ringRadius[5] / 2;
    filterSigma[6] = ringRadius[6] / 2;
    filterSigma[7] = ringRadius[0] / 3; // Center point
    
    // Create the measurement points
    _patternPoints = 0;
    for (int ring = 0; ring < 8; ++ring)
        _patternPoints += FREAKS_CELLS_PER_RING[ring];
    
    // Reset
    if (_sensitiveCells)
        delete[] _sensitiveCells;
    _sensitiveCells = new lbd::IntegratingCell[_patternPoints];
    
    lbd::IntegratingCell* p_cells = _sensitiveCells;
    for (unsigned int ring = 0; ring < 8; ++ring)
    {
        float phi = M_PI / FREAKS_CELLS_PER_RING[ring] * ring;
        float omega = 2.0 * M_PI / FREAKS_CELLS_PER_RING[ring];
        
        updateRingCells(p_cells, FREAKS_CELLS_PER_RING[ring], filterSigma[ring], 
                        ringRadius[ring], omega, phi);
        
        p_cells += FREAKS_CELLS_PER_RING[ring];
    }
    
    // Create the possible pairs
    lbd::BasisFunction* allPairs = new lbd::BasisFunction[_patternPoints*(_patternPoints-1)/2];
    for (unsigned int j = 1, k = 0; j < _patternPoints; ++j)
        for (unsigned i = 0; i < j; ++i, ++k)
        {
            allPairs[k].pos_cell = i;
            allPairs[k].neg_cell = j;
        }
    
    // Now, select randomly lbd::kLbdPairsInUse pairs
    cv::RNG rng(42);
    for (int i = 0; i < _pairsInUse; ++i)
    {
      unsigned int randomPair = rng(lbd::kFreakTotalPairs);
      _basisFunctions[i] = allPairs[randomPair];
    }
    
    // Not needed anymore
    delete[] allPairs;
}